

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorOutputStream.hpp
# Opt level: O3

void __thiscall
binlog::detail::RecoverableVectorOutputStream::RecoverableVectorOutputStream
          (RecoverableVectorOutputStream *this,uint64_t magic,void *id)

{
  uint64_t *puVar1;
  
  (this->_vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::resize(&this->_vector,0x18);
  puVar1 = (uint64_t *)
           (this->_vector).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *puVar1 = magic;
  puVar1[1] = (uint64_t)id;
  puVar1[2] = 0;
  return;
}

Assistant:

RecoverableVectorOutputStream(std::uint64_t magic, void* id)
  {
    _vector.resize(HeaderSize);
    char* buffer = _vector.data();

    memcpy(buffer, &magic, sizeof(magic));
    buffer += sizeof(magic);

    memcpy(buffer, &id, sizeof(id));
    buffer += sizeof(id);

    new (buffer) std::uint64_t{0}; // size
  }